

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O1

ring_buffer_size_t
PaUtil_GetRingBufferReadRegions
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementCount,void **dataPtr1,
          ring_buffer_size_t *sizePtr1,void **dataPtr2,ring_buffer_size_t *sizePtr2)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = rbuf->writeIndex - rbuf->readIndex & rbuf->bigMask;
  if ((long)uVar1 < elementCount) {
    elementCount = uVar1;
  }
  uVar1 = rbuf->smallMask & rbuf->readIndex;
  if (rbuf->bufferSize < (long)(uVar1 + elementCount)) {
    lVar2 = rbuf->bufferSize - uVar1;
    *dataPtr1 = rbuf->buffer + uVar1 * rbuf->elementSizeBytes;
    *sizePtr1 = lVar2;
    *dataPtr2 = rbuf->buffer;
    lVar2 = elementCount - lVar2;
  }
  else {
    *dataPtr1 = rbuf->buffer + uVar1 * rbuf->elementSizeBytes;
    *sizePtr1 = elementCount;
    *dataPtr2 = (void *)0x0;
    lVar2 = 0;
  }
  *sizePtr2 = lVar2;
  return elementCount;
}

Assistant:

ring_buffer_size_t PaUtil_GetRingBufferReadRegions( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementCount,
                                void **dataPtr1, ring_buffer_size_t *sizePtr1,
                                void **dataPtr2, ring_buffer_size_t *sizePtr2 )
{
    ring_buffer_size_t   index;
    ring_buffer_size_t   available = PaUtil_GetRingBufferReadAvailable( rbuf ); /* doesn't use memory barrier */
    if( elementCount > available ) elementCount = available;
    /* Check to see if read is not contiguous. */
    index = rbuf->readIndex & rbuf->smallMask;
    if( (index + elementCount) > rbuf->bufferSize )
    {
        /* Write data in two blocks that wrap the buffer. */
        ring_buffer_size_t firstHalf = rbuf->bufferSize - index;
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = firstHalf;
        *dataPtr2 = &rbuf->buffer[0];
        *sizePtr2 = elementCount - firstHalf;
    }
    else
    {
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = elementCount;
        *dataPtr2 = NULL;
        *sizePtr2 = 0;
    }

    if( available )
        PaUtil_ReadMemoryBarrier(); /* (read-after-read) => read barrier */

    return elementCount;
}